

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O2

float rr::advblend::colorburn(float src,float dst)

{
  float fVar1;
  float fVar2;
  
  fVar1 = 1.0;
  if ((dst < 1.0) && (fVar1 = 0.0, 0.0 < src)) {
    fVar2 = (1.0 - dst) / src;
    fVar1 = 1.0;
    if (fVar2 <= 1.0) {
      fVar1 = fVar2;
    }
    fVar1 = 1.0 - fVar1;
  }
  return fVar1;
}

Assistant:

inline float colorburn (float src, float dst)
{
	if (dst >= 1.0f)
		return 1.0f;
	else if (src > 0.0f)
		return 1.0f - de::min(1.0f, (1.0f-dst)/src);
	else
		return 0.0f;
}